

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  parasail_result_t *ppVar18;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar19;
  int iVar20;
  longlong *plVar21;
  __m128i *palVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  longlong *plVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  __m128i *palVar36;
  ulong uVar37;
  long lVar38;
  longlong lVar39;
  undefined4 uVar53;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  undefined4 uVar60;
  undefined1 in_XMM8 [16];
  __m128i_64_t B;
  undefined1 auVar61 [16];
  __m128i alVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i_64_t B_3;
  int64_t iVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i_64_t B_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128i_64_t B_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  ulong local_c8;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  long local_48;
  undefined8 uStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar32 = (ulong)(uint)s2Len;
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_1();
        }
        else {
          uVar17 = uVar3 - 1;
          uVar1 = (ulong)uVar3 + 1;
          uVar28 = uVar1 >> 1;
          uVar7 = (ulong)uVar17 % uVar28;
          iVar25 = (int)(uVar17 / uVar28);
          iVar19 = -open;
          iVar29 = ppVar5->min;
          uVar37 = 0x8000000000000000 - (long)iVar29;
          if (iVar29 != iVar19 && SBORROW4(iVar29,iVar19) == iVar29 + open < 0) {
            uVar37 = (ulong)(uint)open | 0x8000000000000000;
          }
          iVar29 = ppVar5->max;
          ppVar18 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
          if (ppVar18 != (parasail_result_t *)0x0) {
            ppVar18->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x2820402;
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
            ptr_01 = parasail_memalign___m128i(0x10,uVar28);
            ptr_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr_03 = parasail_memalign___m128i(0x10,uVar28);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar20 = s2Len + -1;
              local_c8 = uVar37 + 1;
              local_48 = 0x7ffffffffffffffe - (long)iVar29;
              uVar59 = (undefined4)local_c8;
              uVar60 = (undefined4)(local_c8 >> 0x20);
              uStack_40 = 0;
              uVar53 = (undefined4)((ulong)local_48 >> 0x20);
              auVar57._8_4_ = (int)local_48;
              auVar57._0_8_ = local_48;
              auVar57._12_4_ = uVar53;
              uVar34 = 0;
              do {
                lVar38 = 0;
                plVar21 = &local_68;
                plVar26 = &local_58;
                bVar15 = true;
                do {
                  bVar35 = bVar15;
                  if (s1_beg == 0) {
                    lVar38 = (long)iVar19 - (lVar38 * uVar28 + uVar34) * (ulong)(uint)gap;
                  }
                  else {
                    lVar38 = 0;
                  }
                  *plVar26 = lVar38;
                  *plVar21 = lVar38 - (ulong)(uint)open;
                  lVar38 = 1;
                  plVar21 = &lStack_60;
                  plVar26 = &lStack_50;
                  bVar15 = false;
                } while (bVar35);
                ptr_02[uVar34][0] = local_58;
                ptr_02[uVar34][1] = lStack_50;
                ptr[uVar34][0] = local_68;
                ptr[uVar34][1] = lStack_60;
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar28);
              *ptr_00 = 0;
              auVar76 = _DAT_00906ca0;
              lVar38 = uVar32 - 1;
              auVar40._8_4_ = (int)lVar38;
              auVar40._0_8_ = lVar38;
              auVar40._12_4_ = (int)((ulong)lVar38 >> 0x20);
              auVar61 = pmovsxbq(in_XMM8,0x100);
              auVar40 = auVar40 ^ _DAT_00906ca0;
              uVar34 = 0;
              do {
                if ((bool)(~(auVar40._0_8_ < (long)(uVar34 ^ auVar76._0_8_)) & 1)) {
                  iVar29 = 0;
                  if (s2_beg == 0) {
                    iVar29 = iVar19;
                  }
                  ptr_00[uVar34 + 1] = (long)iVar29;
                }
                auVar69._8_4_ = (int)uVar34;
                auVar69._0_8_ = uVar34;
                auVar69._12_4_ = (int)(uVar34 >> 0x20);
                if ((long)((auVar69._8_8_ | auVar61._8_8_) ^ auVar76._8_8_) <= auVar40._8_8_) {
                  iVar29 = iVar19 - gap;
                  if (s2_beg != 0) {
                    iVar29 = 0;
                  }
                  ptr_00[uVar34 + 2] = (long)iVar29;
                }
                uVar34 = uVar34 + 2;
                iVar19 = iVar19 + gap * -2;
              } while ((s2Len + 1U & 0xfffffffe) != uVar34);
              alVar62[1] = -(ulong)(uint)open;
              alVar62[0] = -(ulong)(uint)open;
              uVar10 = (uint)uVar28;
              palVar22 = ptr_03 + (uVar10 - 1);
              uVar34 = uVar28;
              do {
                *palVar22 = alVar62;
                lVar38 = alVar62[1];
                alVar62[0] = alVar62[0] - (ulong)(uint)gap;
                alVar62[1] = lVar38 - (ulong)(uint)gap;
                auVar76._0_8_ = -(ulong)(auVar57._0_8_ < alVar62[0]);
                auVar76._8_8_ = -(ulong)(auVar57._8_8_ < alVar62[1]);
                auVar57 = blendvpd((undefined1  [16])alVar62,auVar57,auVar76);
                palVar22 = palVar22 + -1;
                iVar29 = (int)uVar34;
                uVar24 = iVar29 - 1;
                uVar34 = (ulong)uVar24;
              } while (uVar24 != 0 && 0 < iVar29);
              palVar22 = ptr_02 + (uVar10 - 1);
              palVar36 = ptr_02 + uVar7;
              lVar38 = 0;
              auVar61._8_4_ = uVar59;
              auVar61._0_8_ = local_c8;
              auVar61._12_4_ = uVar60;
              auVar63._8_4_ = uVar59;
              auVar63._0_8_ = local_c8;
              auVar63._12_4_ = uVar60;
              uVar34 = 0;
              iVar29 = iVar20;
              do {
                auVar66._8_4_ = (int)(*palVar22)[0];
                auVar66._0_8_ = (*palVar22)[0];
                auVar66._12_4_ = *(undefined4 *)((long)*palVar22 + 4);
                iVar19 = ppVar5->mapper[(byte)s2[uVar34]];
                auVar8._8_4_ = uVar59;
                auVar8._0_8_ = local_c8;
                auVar8._12_4_ = uVar60;
                auVar71._0_8_ = local_c8 - (*ptr_03)[0];
                auVar71._8_8_ = auVar8._8_8_ - (*ptr_03)[1];
                lVar30 = 0;
                auVar73._8_4_ = uVar59;
                auVar73._0_8_ = local_c8;
                auVar73._12_4_ = uVar60;
                iVar65 = ptr_00[uVar34];
                lVar31 = auVar66._8_8_;
                do {
                  plVar2 = (long *)((long)*ptr_02 + lVar30);
                  lVar13 = *plVar2;
                  lVar14 = plVar2[1];
                  plVar2 = (long *)((long)*ptr + lVar30);
                  auVar77._0_8_ = *plVar2 - (ulong)(uint)gap;
                  auVar77._8_8_ = plVar2[1] - (ulong)(uint)gap;
                  plVar2 = (long *)((long)pvVar4 + lVar30 + (long)iVar19 * (long)(int)uVar10 * 0x10)
                  ;
                  auVar67._0_8_ = iVar65 + *plVar2;
                  auVar67._8_8_ = lVar31 + plVar2[1];
                  plVar2 = (long *)((long)*ptr_03 + lVar30);
                  auVar70._0_8_ = auVar71._0_8_ + *plVar2;
                  auVar70._8_8_ = auVar71._8_8_ + plVar2[1];
                  auVar75._0_8_ = lVar13 - (ulong)(uint)open;
                  auVar75._8_8_ = lVar14 - (ulong)(uint)open;
                  auVar41._0_8_ = -(ulong)(auVar70._0_8_ < auVar73._0_8_);
                  auVar41._8_8_ = -(ulong)(auVar70._8_8_ < auVar73._8_8_);
                  auVar73 = blendvpd(auVar70,auVar73,auVar41);
                  auVar42._0_8_ = -(ulong)(auVar75._0_8_ < auVar77._0_8_);
                  auVar42._8_8_ = -(ulong)(auVar75._8_8_ < auVar77._8_8_);
                  auVar76 = blendvpd(auVar75,auVar77,auVar42);
                  auVar43._0_8_ = -(ulong)(auVar67._0_8_ < auVar76._0_8_);
                  auVar43._8_8_ = -(ulong)(auVar67._8_8_ < auVar76._8_8_);
                  auVar71 = blendvpd(auVar67,auVar76,auVar43);
                  *(undefined1 (*) [16])((long)*ptr + lVar30) = auVar76;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar30) = auVar71;
                  lVar30 = lVar30 + 0x10;
                  iVar65 = lVar13;
                  lVar31 = lVar14;
                } while (uVar28 << 4 != lVar30);
                auVar54._0_8_ = auVar71._0_8_;
                auVar54._8_4_ = auVar71._0_4_;
                auVar54._12_4_ = auVar71._4_4_;
                uVar27 = uVar34 + 1;
                lVar31 = ptr_00[uVar34 + 1];
                lVar30 = (*ptr_03)[0] + lVar31;
                if (lVar30 < auVar73._0_8_) {
                  lVar30 = auVar73._0_8_;
                }
                auVar72._8_8_ = lVar30;
                auVar72._0_8_ = local_c8;
                auVar55._8_8_ = auVar54._8_8_;
                auVar55._0_8_ = lVar31;
                auVar44._0_8_ = -(ulong)((long)local_c8 < lVar31);
                auVar44._8_8_ = -(ulong)(lVar30 < auVar55._8_8_);
                auVar76 = blendvpd(auVar72,auVar55,auVar44);
                lVar30 = 0;
                lVar31 = lVar38;
                do {
                  auVar74._0_8_ = auVar72._0_8_ - (ulong)(uint)gap;
                  auVar74._8_8_ = auVar72._8_8_ - (ulong)(uint)gap;
                  auVar68._0_8_ = auVar76._0_8_ - (ulong)(uint)open;
                  auVar68._8_8_ = auVar76._8_8_ - (ulong)(uint)open;
                  auVar45._0_8_ = -(ulong)(auVar68._0_8_ < auVar74._0_8_);
                  auVar45._8_8_ = -(ulong)(auVar68._8_8_ < auVar74._8_8_);
                  auVar72 = blendvpd(auVar68,auVar74,auVar45);
                  auVar76 = *(undefined1 (*) [16])((long)*ptr_01 + lVar30);
                  auVar46._0_8_ = -(ulong)(auVar72._0_8_ < auVar76._0_8_);
                  auVar46._8_8_ = -(ulong)(auVar72._8_8_ < auVar76._8_8_);
                  auVar76 = blendvpd(auVar72,auVar76,auVar46);
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar30) = auVar76;
                  auVar47._0_8_ = -(ulong)(auVar57._0_8_ < auVar76._0_8_);
                  auVar47._8_8_ = -(ulong)(auVar57._8_8_ < auVar76._8_8_);
                  auVar57 = blendvpd(auVar76,auVar57,auVar47);
                  auVar48._0_8_ = -(ulong)(auVar57._0_8_ < auVar72._0_8_);
                  auVar48._8_8_ = -(ulong)(auVar57._8_8_ < auVar72._8_8_);
                  auVar57 = blendvpd(auVar72,auVar57,auVar48);
                  auVar49._0_8_ = -(ulong)(auVar76._0_8_ < auVar63._0_8_);
                  auVar49._8_8_ = -(ulong)(auVar76._8_8_ < auVar63._8_8_);
                  auVar63 = blendvpd(auVar76,auVar63,auVar49);
                  piVar6 = ((ppVar18->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar31) = auVar76._0_4_;
                  *(int *)((long)piVar6 + uVar28 * uVar32 * 4 + lVar31) = auVar76._8_4_;
                  lVar30 = lVar30 + 0x10;
                  lVar31 = lVar31 + uVar32 * 4;
                } while (uVar28 << 4 != lVar30);
                lVar31 = auVar61._0_8_;
                auVar50._0_8_ = -(ulong)(lVar31 < (*palVar36)[0]);
                uVar23 = auVar61._8_8_;
                auVar50._8_8_ = -(ulong)((long)uVar23 < (*palVar36)[1]);
                if (lVar31 < (*palVar36)[0]) {
                  lVar31 = (*palVar36)[0];
                }
                auVar9._8_4_ = (int)-(ulong)(iVar25 == 1);
                auVar9._0_8_ = -(ulong)(iVar25 == 0);
                auVar9._12_4_ = (int)(-(ulong)(iVar25 == 1) >> 0x20);
                if ((long)uVar23 < (*palVar36)[1]) {
                  uVar23 = (*palVar36)[1];
                }
                iVar19 = movmskpd((int)uVar23,auVar50 & auVar9);
                if (iVar19 != 0) {
                  iVar29 = (int)uVar34;
                }
                auVar61._8_8_ = uVar23;
                auVar61._0_8_ = lVar31;
                lVar38 = lVar38 + 4;
                uVar34 = uVar27;
              } while (uVar27 != uVar32);
              if ((s2_end != 0) && (local_c8 = uVar23, iVar25 < 1)) {
                do {
                  local_c8 = auVar61._0_8_;
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = local_c8;
                  auVar61 = auVar11 << 0x40;
                } while (iVar25 < 0);
              }
              uVar24 = uVar17;
              if ((s1_end != 0) && ((uVar1 & 0x7ffffffe) != 0)) {
                uVar12 = (uVar10 & 0x3fffffff) * 2;
                uVar27 = (ulong)uVar12;
                uVar32 = 0;
                do {
                  uVar33 = 0;
                  if ((uVar32 & 1) != 0) {
                    uVar33 = uVar10;
                  }
                  uVar33 = uVar33 + ((uint)(uVar32 >> 1) & 0x7fffffff);
                  iVar19 = iVar29;
                  uVar16 = uVar24;
                  uVar1 = local_c8;
                  if (((int)uVar33 < (int)uVar3) &&
                     (uVar28 = (*ptr_02)[uVar32], iVar19 = iVar20, uVar16 = uVar33, uVar1 = uVar28,
                     (long)uVar28 <= (long)local_c8)) {
                    if ((int)uVar24 <= (int)uVar33) {
                      uVar33 = uVar24;
                    }
                    if (iVar29 != iVar20) {
                      uVar33 = uVar24;
                    }
                    iVar19 = iVar29;
                    uVar16 = uVar24;
                    uVar1 = local_c8;
                    if (uVar28 == local_c8) {
                      uVar16 = uVar33;
                    }
                  }
                  local_c8 = uVar1;
                  uVar24 = uVar16;
                  iVar29 = iVar19;
                  uVar32 = uVar32 + 1;
                } while (uVar12 != (uint)uVar32);
              }
              iVar19 = (int)local_c8;
              if (s2_end == 0 && s1_end == 0) {
                lVar39 = ptr_02[uVar7][0];
                iVar19 = (int)ptr_02[uVar7][1];
                iVar29 = iVar20;
                uVar24 = uVar17;
                if (iVar25 < 1) {
                  do {
                    iVar19 = (int)lVar39;
                    lVar39 = 0;
                  } while (iVar25 < 0);
                }
              }
              auVar51._8_4_ = (int)uVar37;
              auVar51._0_8_ = uVar37;
              auVar51._12_4_ = (int)(uVar37 >> 0x20);
              auVar58._0_8_ = -(ulong)((long)uVar37 < auVar57._0_8_);
              auVar58._8_8_ = -(ulong)(auVar51._8_8_ < auVar57._8_8_);
              auVar52._8_4_ = 0xffffffff;
              auVar52._0_8_ = 0xffffffffffffffff;
              auVar52._12_4_ = 0xffffffff;
              auVar56._8_4_ = (int)local_48;
              auVar56._0_8_ = local_48;
              auVar56._12_4_ = uVar53;
              auVar64._0_8_ = -(ulong)(local_48 < auVar63._0_8_);
              auVar64._8_8_ = -(ulong)(auVar56._8_8_ < auVar63._8_8_);
              iVar25 = movmskpd((int)uVar27,auVar64 | auVar52 ^ auVar58);
              if (iVar25 != 0) {
                *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                iVar19 = 0;
                iVar29 = 0;
                uVar24 = 0;
              }
              ppVar18->score = iVar19;
              ppVar18->end_query = uVar24;
              ppVar18->end_ref = iVar29;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar18;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}